

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

string * nite::keyboardGetText_abi_cxx11_(void)

{
  bool bVar1;
  bool bVar2;
  string *in_RDI;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  bool Upper;
  allocator local_31;
  undefined1 local_30 [8];
  string Char;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = false;
  bVar2 = keyboardCheck(0x2a);
  if ((bVar2) || (bVar2 = keyboardCheck(0x26), bVar2)) {
    bVar1 = true;
  }
  bVar2 = keyboardPressOnce(0x44);
  if (bVar2) {
    if (bVar1) {
      local_70 = "_";
    }
    else {
      local_70 = "-";
    }
    std::__cxx11::string::operator=((string *)local_30,local_70);
  }
  else {
    bVar2 = keyboardPressOnce(0x37);
    if (bVar2) {
      if (bVar1) {
        local_78 = "+";
      }
      else {
        local_78 = "=";
      }
      std::__cxx11::string::operator=((string *)local_30,local_78);
    }
    else {
      bVar2 = keyboardPressOnce(0x31);
      if (bVar2) {
        if (bVar1) {
          local_80 = "<";
        }
        else {
          local_80 = ",";
        }
        std::__cxx11::string::operator=((string *)local_30,local_80);
      }
      else {
        bVar2 = keyboardPressOnce(0x32);
        if (bVar2) {
          if (bVar1) {
            local_88 = ">";
          }
          else {
            local_88 = ".";
          }
          std::__cxx11::string::operator=((string *)local_30,local_88);
        }
        else {
          bVar2 = keyboardPressOnce(0x46);
          if (bVar2) {
            if (bVar1) {
              local_90 = "?";
            }
            else {
              local_90 = "/";
            }
            std::__cxx11::string::operator=((string *)local_30,local_90);
          }
          else {
            bVar2 = keyboardPressOnce(0x33);
            if (bVar2) {
              if (bVar1) {
                local_98 = "\"";
              }
              else {
                local_98 = "\'";
              }
              std::__cxx11::string::operator=((string *)local_30,local_98);
            }
            else {
              bVar2 = keyboardPressOnce(0x30);
              if (bVar2) {
                if (bVar1) {
                  local_a0 = ":";
                }
                else {
                  local_a0 = ";";
                }
                std::__cxx11::string::operator=((string *)local_30,local_a0);
              }
              else {
                bVar2 = keyboardPressOnce(0x2e);
                if (bVar2) {
                  if (bVar1) {
                    local_a8 = "{";
                  }
                  else {
                    local_a8 = "[";
                  }
                  std::__cxx11::string::operator=((string *)local_30,local_a8);
                }
                else {
                  bVar2 = keyboardPressOnce(0x2f);
                  if (bVar2) {
                    if (bVar1) {
                      local_b0 = "}";
                    }
                    else {
                      local_b0 = "]";
                    }
                    std::__cxx11::string::operator=((string *)local_30,local_b0);
                  }
                  else {
                    bVar2 = keyboardPressOnce(0x35);
                    if (bVar2) {
                      if (bVar1) {
                        local_b8 = "|";
                      }
                      else {
                        local_b8 = "\\";
                      }
                      std::__cxx11::string::operator=((string *)local_30,local_b8);
                    }
                    else {
                      bVar2 = keyboardPressOnce(0x1a);
                      if (bVar2) {
                        if (bVar1) {
                          local_c0 = ")";
                        }
                        else {
                          local_c0 = "0";
                        }
                        std::__cxx11::string::operator=((string *)local_30,local_c0);
                      }
                      else {
                        bVar2 = keyboardPressOnce(0x1b);
                        if (bVar2) {
                          if (bVar1) {
                            local_c8 = "!";
                          }
                          else {
                            local_c8 = "1";
                          }
                          std::__cxx11::string::operator=((string *)local_30,local_c8);
                        }
                        else {
                          bVar2 = keyboardPressOnce(0x1c);
                          if (bVar2) {
                            if (bVar1) {
                              local_d0 = "@";
                            }
                            else {
                              local_d0 = "2";
                            }
                            std::__cxx11::string::operator=((string *)local_30,local_d0);
                          }
                          else {
                            bVar2 = keyboardPressOnce(0x1d);
                            if (bVar2) {
                              if (bVar1) {
                                local_d8 = "#";
                              }
                              else {
                                local_d8 = "3";
                              }
                              std::__cxx11::string::operator=((string *)local_30,local_d8);
                            }
                            else {
                              bVar2 = keyboardPressOnce(0x1e);
                              if (bVar2) {
                                if (bVar1) {
                                  local_e0 = "$";
                                }
                                else {
                                  local_e0 = "4";
                                }
                                std::__cxx11::string::operator=((string *)local_30,local_e0);
                              }
                              else {
                                bVar2 = keyboardPressOnce(0x1f);
                                if (bVar2) {
                                  if (bVar1) {
                                    local_e8 = "%";
                                  }
                                  else {
                                    local_e8 = "5";
                                  }
                                  std::__cxx11::string::operator=((string *)local_30,local_e8);
                                }
                                else {
                                  bVar2 = keyboardPressOnce(0x20);
                                  if (bVar2) {
                                    if (bVar1) {
                                      local_f0 = "^";
                                    }
                                    else {
                                      local_f0 = "6";
                                    }
                                    std::__cxx11::string::operator=((string *)local_30,local_f0);
                                  }
                                  else {
                                    bVar2 = keyboardPressOnce(0x21);
                                    if (bVar2) {
                                      if (bVar1) {
                                        local_f8 = "&";
                                      }
                                      else {
                                        local_f8 = "7";
                                      }
                                      std::__cxx11::string::operator=((string *)local_30,local_f8);
                                    }
                                    else {
                                      bVar2 = keyboardPressOnce(0x22);
                                      if (bVar2) {
                                        if (bVar1) {
                                          local_100 = "*";
                                        }
                                        else {
                                          local_100 = "8";
                                        }
                                        std::__cxx11::string::operator=
                                                  ((string *)local_30,local_100);
                                      }
                                      else {
                                        bVar2 = keyboardPressOnce(0x23);
                                        if (bVar2) {
                                          if (bVar1) {
                                            local_108 = "(";
                                          }
                                          else {
                                            local_108 = "9";
                                          }
                                          std::__cxx11::string::operator=
                                                    ((string *)local_30,local_108);
                                        }
                                        else {
                                          bVar2 = keyboardPressOnce(0);
                                          if (bVar2) {
                                            std::__cxx11::string::operator=((string *)local_30,"a");
                                          }
                                          else {
                                            bVar2 = keyboardPressOnce(1);
                                            if (bVar2) {
                                              std::__cxx11::string::operator=
                                                        ((string *)local_30,"b");
                                            }
                                            else {
                                              bVar2 = keyboardPressOnce(2);
                                              if (bVar2) {
                                                std::__cxx11::string::operator=
                                                          ((string *)local_30,"c");
                                              }
                                              else {
                                                bVar2 = keyboardPressOnce(3);
                                                if (bVar2) {
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_30,"d");
                                                }
                                                else {
                                                  bVar2 = keyboardPressOnce(4);
                                                  if (bVar2) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_30,"e");
                                                  }
                                                  else {
                                                    bVar2 = keyboardPressOnce(5);
                                                    if (bVar2) {
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_30,"f");
                                                    }
                                                    else {
                                                      bVar2 = keyboardPressOnce(6);
                                                      if (bVar2) {
                                                        std::__cxx11::string::operator=
                                                                  ((string *)local_30,"g");
                                                      }
                                                      else {
                                                        bVar2 = keyboardPressOnce(7);
                                                        if (bVar2) {
                                                          std::__cxx11::string::operator=
                                                                    ((string *)local_30,"h");
                                                        }
                                                        else {
                                                          bVar2 = keyboardPressOnce(8);
                                                          if (bVar2) {
                                                            std::__cxx11::string::operator=
                                                                      ((string *)local_30,"i");
                                                          }
                                                          else {
                                                            bVar2 = keyboardPressOnce(9);
                                                            if (bVar2) {
                                                              std::__cxx11::string::operator=
                                                                        ((string *)local_30,"j");
                                                            }
                                                            else {
                                                              bVar2 = keyboardPressOnce(10);
                                                              if (bVar2) {
                                                                std::__cxx11::string::operator=
                                                                          ((string *)local_30,"k");
                                                              }
                                                              else {
                                                                bVar2 = keyboardPressOnce(0xb);
                                                                if (bVar2) {
                                                                  std::__cxx11::string::operator=
                                                                            ((string *)local_30,"l")
                                                                  ;
                                                                }
                                                                else {
                                                                  bVar2 = keyboardPressOnce(0xc);
                                                                  if (bVar2) {
                                                                    std::__cxx11::string::operator=
                                                                              ((string *)local_30,
                                                                               "m");
                                                                  }
                                                                  else {
                                                                    bVar2 = keyboardPressOnce(0xd);
                                                                    if (bVar2) {
                                                                      std::__cxx11::string::
                                                                      operator=((string *)local_30,
                                                                                "n");
                                                                    }
                                                                    else {
                                                                      bVar2 = keyboardPressOnce(0xe)
                                                                      ;
                                                                      if (bVar2) {
                                                                        std::__cxx11::string::
                                                                        operator=((string *)local_30
                                                                                  ,"o");
                                                                      }
                                                                      else {
                                                                        bVar2 = keyboardPressOnce(
                                                  0xf);
                                                  if (bVar2) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_30,"p");
                                                  }
                                                  else {
                                                    bVar2 = keyboardPressOnce(0x10);
                                                    if (bVar2) {
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_30,"q");
                                                    }
                                                    else {
                                                      bVar2 = keyboardPressOnce(0x11);
                                                      if (bVar2) {
                                                        std::__cxx11::string::operator=
                                                                  ((string *)local_30,"r");
                                                      }
                                                      else {
                                                        bVar2 = keyboardPressOnce(0x12);
                                                        if (bVar2) {
                                                          std::__cxx11::string::operator=
                                                                    ((string *)local_30,"s");
                                                        }
                                                        else {
                                                          bVar2 = keyboardPressOnce(0x13);
                                                          if (bVar2) {
                                                            std::__cxx11::string::operator=
                                                                      ((string *)local_30,"t");
                                                          }
                                                          else {
                                                            bVar2 = keyboardPressOnce(0x14);
                                                            if (bVar2) {
                                                              std::__cxx11::string::operator=
                                                                        ((string *)local_30,"u");
                                                            }
                                                            else {
                                                              bVar2 = keyboardPressOnce(0x15);
                                                              if (bVar2) {
                                                                std::__cxx11::string::operator=
                                                                          ((string *)local_30,"v");
                                                              }
                                                              else {
                                                                bVar2 = keyboardPressOnce(0x16);
                                                                if (bVar2) {
                                                                  std::__cxx11::string::operator=
                                                                            ((string *)local_30,"w")
                                                                  ;
                                                                }
                                                                else {
                                                                  bVar2 = keyboardPressOnce(0x17);
                                                                  if (bVar2) {
                                                                    std::__cxx11::string::operator=
                                                                              ((string *)local_30,
                                                                               "x");
                                                                  }
                                                                  else {
                                                                    bVar2 = keyboardPressOnce(0x18);
                                                                    if (bVar2) {
                                                                      std::__cxx11::string::
                                                                      operator=((string *)local_30,
                                                                                "y");
                                                                    }
                                                                    else {
                                                                      bVar2 = keyboardPressOnce(0x19
                                                  );
                                                  if (bVar2) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_30,"z");
                                                  }
                                                  else {
                                                    bVar2 = keyboardPressOnce(0x39);
                                                    if (bVar2) {
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_30," ");
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (bVar1) {
    toUpper(in_RDI,(string *)local_30);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

String nite::keyboardGetText(){
	String Char = "";
	bool Upper = 0;
	if (nite::keyboardCheck(keyRSHIFT) or nite::keyboardCheck(keyLSHIFT)){
		Upper = 1;
	}
	if (nite::keyboardPressOnce(keySUBTRACT)){
		Char = ( Upper ? "_":"-" );
	}else
	if (nite::keyboardPressOnce(keyEQUAL)){
		Char = ( Upper ? "+":"=" );
	}else
	if (nite::keyboardPressOnce(keyCOMMA)){
		Char = ( Upper ? "<":"," );
	}else
	if (nite::keyboardPressOnce(keyPERIOD)){
		Char = ( Upper ? ">":"." );
	}else
	if (nite::keyboardPressOnce(keyDIVIDE)){
		Char = ( Upper ? "?":"/" );
	}else
	if (nite::keyboardPressOnce(keyQUOTE)){
		Char = ( Upper ? "\"":"'" );
	}else
	if (nite::keyboardPressOnce(keySEMICOLON)){
		Char = ( Upper ? ":":";" );
	}else
	if (nite::keyboardPressOnce(keyLBRACKET)){
		Char = ( Upper ? "{":"[" );
	}else
	if (nite::keyboardPressOnce(keyRBRACKET)){
		Char = ( Upper ? "}":"]" );
	}else
	if (nite::keyboardPressOnce(keyBACKSLASH)){
		Char = ( Upper ? "|":"\\" );
	}else
	if (nite::keyboardPressOnce(key0)){
		Char = ( Upper ? ")":"0" );
	}else
	if (nite::keyboardPressOnce(key1)){
		Char = ( Upper ? "!":"1" );
	}else
	if (nite::keyboardPressOnce(key2)){
		Char = ( Upper ? "@":"2" );
	}else
	if (nite::keyboardPressOnce(key3)){
		Char = ( Upper ? "#":"3" );
	}else
	if (nite::keyboardPressOnce(key4)){
		Char = ( Upper ? "$":"4" );
	}else
	if (nite::keyboardPressOnce(key5)){
		Char = ( Upper ? "%":"5" );
	}else
	if (nite::keyboardPressOnce(key6)){
		Char = ( Upper ? "^":"6" );
	}else
	if (nite::keyboardPressOnce(key7)){
		Char = ( Upper ? "&":"7" );
	}else
	if (nite::keyboardPressOnce(key8)){
		Char = ( Upper ? "*":"8" );
	}else
	if (nite::keyboardPressOnce(key9)){
		Char = ( Upper ? "(":"9" );
	}else
	if (nite::keyboardPressOnce(keyA)){
		Char = "a";
	}else
	if (nite::keyboardPressOnce(keyB)){
		Char = "b";
	}else
	if (nite::keyboardPressOnce(keyC)){
		Char = "c";
	}else
	if (nite::keyboardPressOnce(keyD)){
		Char = "d";
	}else
	if (nite::keyboardPressOnce(keyE)){
		Char = "e";
	}else
	if (nite::keyboardPressOnce(keyF)){
		Char = "f";
	}else
	if (nite::keyboardPressOnce(keyG)){
		Char = "g";
	}else
	if (nite::keyboardPressOnce(keyH)){
		Char = "h";
	}else
	if (nite::keyboardPressOnce(keyI)){
		Char = "i";
	}else
	if (nite::keyboardPressOnce(keyJ)){
		Char = "j";
	}else
	if (nite::keyboardPressOnce(keyK)){
		Char = "k";
	}else
	if (nite::keyboardPressOnce(keyL)){
		Char = "l";
	}else
	if (nite::keyboardPressOnce(keyM)){
		Char = "m";
	}else
	if (nite::keyboardPressOnce(keyN)){
		Char = "n";
	}else
	if (nite::keyboardPressOnce(keyO)){
		Char = "o";
	}else
	if (nite::keyboardPressOnce(keyP)){
		Char = "p";
	}else
	if (nite::keyboardPressOnce(keyQ)){
		Char = "q";
	}else
	if (nite::keyboardPressOnce(keyR)){
		Char = "r";
	}else
	if (nite::keyboardPressOnce(keyS)){
		Char = "s";
	}else
	if (nite::keyboardPressOnce(keyT)){
		Char = "t";
	}else
	if (nite::keyboardPressOnce(keyU)){
		Char = "u";
	}else
	if (nite::keyboardPressOnce(keyV)){
		Char = "v";
	}else
	if (nite::keyboardPressOnce(keyW)){
		Char = "w";
	}else
	if (nite::keyboardPressOnce(keyX)){
		Char = "x";
	}else
	if (nite::keyboardPressOnce(keyY)){
		Char = "y";
	}else
	if (nite::keyboardPressOnce(keyZ)){
		Char = "z";
	}else
	if (nite::keyboardPressOnce(keySPACE)){
		Char = " ";
	}
	return (Upper ? nite::toUpper(Char) : Char);
}